

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Scene *pSVar9;
  Ref<embree::Geometry> *pRVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined8 *puVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 (*pauVar35) [16];
  uint uVar36;
  AABBNodeMB4D *node1;
  ulong uVar37;
  long lVar38;
  long lVar39;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  Scene *scene;
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  vint4 bi_1;
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  vint4 bi;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  vint4 ai;
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar91 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  uint uVar98;
  uint uVar99;
  undefined1 auVar97 [64];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 (*local_1500) [16];
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 *local_14b8;
  ulong local_14b0;
  ulong local_14a8;
  ulong local_14a0;
  ulong local_1498;
  undefined8 *local_1490;
  Scene *local_1488;
  long local_1480;
  long local_1478;
  ulong local_1470;
  ulong local_1468;
  ulong local_1460;
  ulong local_1458;
  ulong local_1450;
  ulong local_1448;
  ulong local_1440;
  long local_1438;
  RTCFilterFunctionNArguments local_1430;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [16];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  RTCHitN local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined4 local_1230;
  undefined4 uStack_122c;
  undefined4 uStack_1228;
  undefined4 uStack_1224;
  undefined4 local_1220;
  undefined4 uStack_121c;
  undefined4 uStack_1218;
  undefined4 uStack_1214;
  undefined1 local_1210 [16];
  uint local_1200;
  uint uStack_11fc;
  uint uStack_11f8;
  uint uStack_11f4;
  uint uStack_11f0;
  uint uStack_11ec;
  uint uStack_11e8;
  uint uStack_11e4;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  float local_1080 [4];
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  undefined4 uStack_1064;
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_1500 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1360._4_4_ = fVar1;
  local_1360._0_4_ = fVar1;
  local_1360._8_4_ = fVar1;
  local_1360._12_4_ = fVar1;
  auVar87 = ZEXT1664(local_1360);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1370._4_4_ = fVar2;
  local_1370._0_4_ = fVar2;
  local_1370._8_4_ = fVar2;
  local_1370._12_4_ = fVar2;
  auVar91 = ZEXT1664(local_1370);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar88 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1380._4_4_ = fVar88;
  local_1380._0_4_ = fVar88;
  local_1380._8_4_ = fVar88;
  local_1380._12_4_ = fVar88;
  auVar97 = ZEXT1664(local_1380);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar88 = fVar88 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1498 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_14a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_14a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_14b0 = local_1498 ^ 0x10;
  uVar44 = local_14a0 ^ 0x10;
  uVar48 = local_14a8 ^ 0x10;
  iVar41 = (tray->tfar).field_0.i[k];
  auVar63 = ZEXT1664(CONCAT412(iVar41,CONCAT48(iVar41,CONCAT44(iVar41,iVar41))));
  local_1390._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_1390._8_4_ = -fVar1;
  local_1390._12_4_ = -fVar1;
  auVar101 = ZEXT1664(local_1390);
  local_13a0._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_13a0._8_4_ = -fVar2;
  local_13a0._12_4_ = -fVar2;
  auVar104 = ZEXT1664(local_13a0);
  iVar41 = (tray->tnear).field_0.i[k];
  local_13b0._4_4_ = iVar41;
  local_13b0._0_4_ = iVar41;
  local_13b0._8_4_ = iVar41;
  local_13b0._12_4_ = iVar41;
  auVar106 = ZEXT1664(local_13b0);
  local_fe0._16_16_ = mm_lookupmask_ps._240_16_;
  local_fe0._0_16_ = mm_lookupmask_ps._0_16_;
  local_13c0._0_8_ = CONCAT44(fVar88,fVar88) ^ 0x8000000080000000;
  local_13c0._8_4_ = -fVar88;
  local_13c0._12_4_ = -fVar88;
  auVar110 = ZEXT1664(local_13c0);
  local_1490 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar60._8_4_ = 0x3f800000;
  auVar60._0_8_ = &DAT_3f8000003f800000;
  auVar60._12_4_ = 0x3f800000;
  auVar60._16_4_ = 0x3f800000;
  auVar60._20_4_ = 0x3f800000;
  auVar60._24_4_ = 0x3f800000;
  auVar60._28_4_ = 0x3f800000;
  auVar86._8_4_ = 0xbf800000;
  auVar86._0_8_ = 0xbf800000bf800000;
  auVar86._12_4_ = 0xbf800000;
  auVar86._16_4_ = 0xbf800000;
  auVar86._20_4_ = 0xbf800000;
  auVar86._24_4_ = 0xbf800000;
  auVar86._28_4_ = 0xbf800000;
  local_1000 = vblendvps_avx(auVar60,auVar86,local_fe0);
  uVar43 = local_1498;
  uVar42 = local_14a8;
  uVar46 = local_14b0;
  uVar47 = local_14a0;
  local_14b8 = local_1490;
  do {
    do {
      do {
        if (local_1500 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar35 = local_1500 + -1;
        local_1500 = local_1500 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar35 + 8));
      uVar53 = *(ulong *)*local_1500;
      do {
        if ((uVar53 & 8) == 0) {
          uVar37 = uVar53 & 0xfffffffffffffff0;
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar64._4_4_ = uVar3;
          auVar64._0_4_ = uVar3;
          auVar64._8_4_ = uVar3;
          auVar64._12_4_ = uVar3;
          auVar66 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + uVar43),auVar64,
                                    *(undefined1 (*) [16])(uVar37 + 0x20 + uVar43));
          auVar66 = vfmadd213ps_fma(auVar66,auVar87._0_16_,auVar101._0_16_);
          auVar65 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + uVar47),auVar64,
                                    *(undefined1 (*) [16])(uVar37 + 0x20 + uVar47));
          auVar65 = vfmadd213ps_fma(auVar65,auVar91._0_16_,auVar104._0_16_);
          auVar66 = vpmaxsd_avx(auVar66,auVar65);
          auVar65 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + uVar42),auVar64,
                                    *(undefined1 (*) [16])(uVar37 + 0x20 + uVar42));
          auVar65 = vfmadd213ps_fma(auVar65,auVar97._0_16_,auVar110._0_16_);
          auVar65 = vpmaxsd_avx(auVar65,auVar106._0_16_);
          auVar72 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + uVar46),auVar64,
                                    *(undefined1 (*) [16])(uVar37 + 0x20 + uVar46));
          auVar66 = vpmaxsd_avx(auVar66,auVar65);
          auVar65 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + uVar44),auVar64,
                                    *(undefined1 (*) [16])(uVar37 + 0x20 + uVar44));
          auVar72 = vfmadd213ps_fma(auVar72,auVar87._0_16_,auVar101._0_16_);
          auVar65 = vfmadd213ps_fma(auVar65,auVar91._0_16_,auVar104._0_16_);
          auVar65 = vpminsd_avx(auVar72,auVar65);
          auVar72 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + uVar48),auVar64,
                                    *(undefined1 (*) [16])(uVar37 + 0x20 + uVar48));
          auVar72 = vfmadd213ps_fma(auVar72,auVar97._0_16_,auVar110._0_16_);
          auVar72 = vpminsd_avx(auVar72,auVar63._0_16_);
          auVar65 = vpminsd_avx(auVar65,auVar72);
          if (((uint)uVar53 & 7) == 6) {
            auVar72 = vcmpps_avx(auVar66,auVar65,2);
            auVar65 = vcmpps_avx(*(undefined1 (*) [16])(uVar37 + 0xe0),auVar64,2);
            auVar64 = vcmpps_avx(auVar64,*(undefined1 (*) [16])(uVar37 + 0xf0),1);
            auVar65 = vandps_avx(auVar65,auVar64);
            auVar65 = vandps_avx(auVar65,auVar72);
          }
          else {
            auVar65 = vcmpps_avx(auVar66,auVar65,2);
          }
          auVar65 = vpslld_avx(auVar65,0x1f);
          uVar40 = vmovmskps_avx(auVar65);
          local_1490 = (undefined8 *)(ulong)uVar40;
          local_11e0._0_16_ = auVar66;
        }
        if ((uVar53 & 8) == 0) {
          if (local_1490 == (undefined8 *)0x0) {
            iVar41 = 4;
          }
          else {
            uVar37 = uVar53 & 0xfffffffffffffff0;
            lVar39 = 0;
            for (puVar26 = local_1490; ((ulong)puVar26 & 1) == 0;
                puVar26 = (undefined8 *)((ulong)puVar26 >> 1 | 0x8000000000000000)) {
              lVar39 = lVar39 + 1;
            }
            iVar41 = 0;
            uVar45 = (long)local_1490 - 1U & (ulong)local_1490;
            uVar53 = *(ulong *)(uVar37 + lVar39 * 8);
            if (uVar45 != 0) {
              uVar40 = *(uint *)(local_11e0 + lVar39 * 4);
              lVar39 = 0;
              for (uVar50 = uVar45; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
                lVar39 = lVar39 + 1;
              }
              uVar45 = uVar45 - 1 & uVar45;
              uVar50 = *(ulong *)(uVar37 + lVar39 * 8);
              uVar36 = *(uint *)(local_11e0 + lVar39 * 4);
              if (uVar45 == 0) {
                if (uVar40 < uVar36) {
                  *(ulong *)*local_1500 = uVar50;
                  *(uint *)(*local_1500 + 8) = uVar36;
                  local_1500 = local_1500 + 1;
                }
                else {
                  *(ulong *)*local_1500 = uVar53;
                  *(uint *)(*local_1500 + 8) = uVar40;
                  uVar53 = uVar50;
                  local_1500 = local_1500 + 1;
                }
              }
              else {
                auVar66._8_8_ = 0;
                auVar66._0_8_ = uVar53;
                auVar66 = vpunpcklqdq_avx(auVar66,ZEXT416(uVar40));
                auVar65._8_8_ = 0;
                auVar65._0_8_ = uVar50;
                auVar65 = vpunpcklqdq_avx(auVar65,ZEXT416(uVar36));
                lVar39 = 0;
                for (uVar53 = uVar45; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000)
                {
                  lVar39 = lVar39 + 1;
                }
                uVar45 = uVar45 - 1 & uVar45;
                auVar72._8_8_ = 0;
                auVar72._0_8_ = *(ulong *)(uVar37 + lVar39 * 8);
                auVar64 = vpunpcklqdq_avx(auVar72,ZEXT416(*(uint *)(local_11e0 + lVar39 * 4)));
                auVar72 = vpcmpgtd_avx(auVar65,auVar66);
                if (uVar45 == 0) {
                  auVar78 = vpshufd_avx(auVar72,0xaa);
                  auVar72 = vblendvps_avx(auVar65,auVar66,auVar78);
                  auVar66 = vblendvps_avx(auVar66,auVar65,auVar78);
                  auVar65 = vpcmpgtd_avx(auVar64,auVar72);
                  auVar78 = vpshufd_avx(auVar65,0xaa);
                  auVar65 = vblendvps_avx(auVar64,auVar72,auVar78);
                  auVar72 = vblendvps_avx(auVar72,auVar64,auVar78);
                  auVar64 = vpcmpgtd_avx(auVar72,auVar66);
                  auVar78 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar72,auVar66,auVar78);
                  auVar66 = vblendvps_avx(auVar66,auVar72,auVar78);
                  *local_1500 = auVar66;
                  local_1500[1] = auVar64;
                  uVar53 = auVar65._0_8_;
                  local_1500 = local_1500 + 2;
                }
                else {
                  lVar39 = 0;
                  for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                    lVar39 = lVar39 + 1;
                  }
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = *(ulong *)(uVar37 + lVar39 * 8);
                  auVar54 = vpunpcklqdq_avx(auVar78,ZEXT416(*(uint *)(local_11e0 + lVar39 * 4)));
                  auVar78 = vpshufd_avx(auVar72,0xaa);
                  auVar72 = vblendvps_avx(auVar65,auVar66,auVar78);
                  auVar66 = vblendvps_avx(auVar66,auVar65,auVar78);
                  auVar65 = vpcmpgtd_avx(auVar54,auVar64);
                  auVar78 = vpshufd_avx(auVar65,0xaa);
                  auVar65 = vblendvps_avx(auVar54,auVar64,auVar78);
                  auVar64 = vblendvps_avx(auVar64,auVar54,auVar78);
                  auVar78 = vpcmpgtd_avx(auVar64,auVar66);
                  auVar54 = vpshufd_avx(auVar78,0xaa);
                  auVar78 = vblendvps_avx(auVar64,auVar66,auVar54);
                  auVar66 = vblendvps_avx(auVar66,auVar64,auVar54);
                  auVar64 = vpcmpgtd_avx(auVar65,auVar72);
                  auVar54 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar65,auVar72,auVar54);
                  auVar65 = vblendvps_avx(auVar72,auVar65,auVar54);
                  auVar72 = vpcmpgtd_avx(auVar78,auVar65);
                  auVar54 = vpshufd_avx(auVar72,0xaa);
                  auVar72 = vblendvps_avx(auVar78,auVar65,auVar54);
                  auVar65 = vblendvps_avx(auVar65,auVar78,auVar54);
                  *local_1500 = auVar66;
                  local_1500[1] = auVar65;
                  local_1500[2] = auVar72;
                  uVar53 = auVar64._0_8_;
                  local_1500 = local_1500 + 3;
                }
              }
            }
          }
        }
        else {
          iVar41 = 6;
        }
      } while (iVar41 == 0);
    } while (iVar41 != 6);
    local_1480 = (ulong)((uint)uVar53 & 0xf) - 8;
    if (local_1480 != 0) {
      uVar53 = uVar53 & 0xfffffffffffffff0;
      lVar39 = 0;
      do {
        lVar38 = lVar39 * 0x60;
        pSVar9 = context->scene;
        pRVar10 = (pSVar9->geometries).items;
        pGVar11 = pRVar10[*(uint *)(uVar53 + 0x40 + lVar38)].ptr;
        fVar1 = (pGVar11->time_range).lower;
        fVar1 = pGVar11->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar11->time_range).upper - fVar1));
        auVar66 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
        auVar66 = vminss_avx(auVar66,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
        auVar16 = vmaxss_avx(ZEXT816(0) << 0x20,auVar66);
        iVar41 = (int)auVar16._0_4_;
        lVar49 = (long)iVar41 * 0x38;
        lVar12 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar49);
        local_1468 = (ulong)*(uint *)(uVar53 + 4 + lVar38);
        auVar66 = *(undefined1 (*) [16])(lVar12 + (ulong)*(uint *)(uVar53 + lVar38) * 4);
        local_1448 = (ulong)*(uint *)(uVar53 + 0x10 + lVar38);
        auVar65 = *(undefined1 (*) [16])(lVar12 + local_1448 * 4);
        uVar42 = (ulong)*(uint *)(uVar53 + 0x20 + lVar38);
        auVar72 = *(undefined1 (*) [16])(lVar12 + uVar42 * 4);
        uVar46 = (ulong)*(uint *)(uVar53 + 0x30 + lVar38);
        auVar64 = *(undefined1 (*) [16])(lVar12 + uVar46 * 4);
        local_1478 = *(long *)&pRVar10[*(uint *)(uVar53 + 0x44 + lVar38)].ptr[2].numPrimitives;
        lVar12 = *(long *)(local_1478 + lVar49);
        auVar78 = *(undefined1 (*) [16])(lVar12 + local_1468 * 4);
        local_1458 = (ulong)*(uint *)(uVar53 + 0x14 + lVar38);
        auVar54 = *(undefined1 (*) [16])(lVar12 + local_1458 * 4);
        local_1450 = (ulong)*(uint *)(uVar53 + 0x24 + lVar38);
        auVar5 = *(undefined1 (*) [16])(lVar12 + local_1450 * 4);
        local_1440 = (ulong)*(uint *)(uVar53 + 0x34 + lVar38);
        auVar6 = *(undefined1 (*) [16])(lVar12 + local_1440 * 4);
        lVar12 = *(long *)&pRVar10[*(uint *)(uVar53 + 0x48 + lVar38)].ptr[2].numPrimitives;
        lVar13 = *(long *)(lVar12 + lVar49);
        uVar47 = (ulong)*(uint *)(uVar53 + 8 + lVar38);
        auVar68 = *(undefined1 (*) [16])(lVar13 + uVar47 * 4);
        uVar52 = (ulong)*(uint *)(uVar53 + 0x18 + lVar38);
        auVar7 = *(undefined1 (*) [16])(lVar13 + uVar52 * 4);
        local_1470 = (ulong)*(uint *)(uVar53 + 0x28 + lVar38);
        auVar8 = *(undefined1 (*) [16])(lVar13 + local_1470 * 4);
        local_1460 = (ulong)*(uint *)(uVar53 + 0x38 + lVar38);
        auVar70 = *(undefined1 (*) [16])(lVar13 + local_1460 * 4);
        fVar1 = fVar1 - auVar16._0_4_;
        lVar13 = *(long *)&pRVar10[*(uint *)(uVar53 + 0x4c + lVar38)].ptr[2].numPrimitives;
        lVar49 = *(long *)(lVar13 + lVar49);
        uVar43 = (ulong)*(uint *)(uVar53 + 0xc + lVar38);
        auVar16 = *(undefined1 (*) [16])(lVar49 + uVar43 * 4);
        uVar50 = (ulong)*(uint *)(uVar53 + 0x1c + lVar38);
        auVar79 = *(undefined1 (*) [16])(lVar49 + uVar50 * 4);
        auVar67 = vunpcklps_avx(auVar66,auVar68);
        auVar68 = vunpckhps_avx(auVar66,auVar68);
        auVar73 = vunpcklps_avx(auVar78,auVar16);
        auVar78 = vunpckhps_avx(auVar78,auVar16);
        uVar37 = (ulong)*(uint *)(uVar53 + 0x2c + lVar38);
        auVar66 = *(undefined1 (*) [16])(lVar49 + uVar37 * 4);
        local_12c0 = vunpcklps_avx(auVar68,auVar78);
        local_1300 = vunpcklps_avx(auVar67,auVar73);
        local_12e0 = vunpckhps_avx(auVar67,auVar73);
        auVar68 = vunpcklps_avx(auVar65,auVar7);
        auVar78 = vunpckhps_avx(auVar65,auVar7);
        auVar7 = vunpcklps_avx(auVar54,auVar79);
        auVar54 = vunpckhps_avx(auVar54,auVar79);
        uVar45 = (ulong)*(uint *)(uVar53 + 0x3c + lVar38);
        auVar65 = *(undefined1 (*) [16])(lVar49 + uVar45 * 4);
        local_12b0 = vunpcklps_avx(auVar78,auVar54);
        local_12f0 = vunpcklps_avx(auVar68,auVar7);
        local_12d0 = vunpckhps_avx(auVar68,auVar7);
        auVar54 = vunpcklps_avx(auVar72,auVar8);
        auVar72 = vunpckhps_avx(auVar72,auVar8);
        auVar68 = vunpcklps_avx(auVar5,auVar66);
        auVar78 = vunpckhps_avx(auVar5,auVar66);
        lVar51 = (long)(iVar41 + 1) * 0x38;
        lVar49 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar51);
        auVar66 = *(undefined1 (*) [16])(lVar49 + (ulong)*(uint *)(uVar53 + lVar38) * 4);
        local_1310 = vunpcklps_avx(auVar72,auVar78);
        local_1340 = vunpcklps_avx(auVar54,auVar68);
        local_1330 = vunpckhps_avx(auVar54,auVar68);
        auVar78 = vunpcklps_avx(auVar64,auVar70);
        auVar72 = vunpckhps_avx(auVar64,auVar70);
        auVar54 = vunpcklps_avx(auVar6,auVar65);
        auVar64 = vunpckhps_avx(auVar6,auVar65);
        lVar12 = *(long *)(lVar12 + lVar51);
        auVar65 = *(undefined1 (*) [16])(lVar12 + uVar47 * 4);
        local_1320 = vunpcklps_avx(auVar72,auVar64);
        auVar5 = vunpcklps_avx(auVar78,auVar54);
        local_1350 = vunpckhps_avx(auVar78,auVar54);
        lVar14 = *(long *)(local_1478 + lVar51);
        auVar64 = vunpcklps_avx(auVar66,auVar65);
        auVar72 = vunpckhps_avx(auVar66,auVar65);
        auVar66 = *(undefined1 (*) [16])(lVar14 + local_1468 * 4);
        lVar13 = *(long *)(lVar13 + lVar51);
        auVar65 = *(undefined1 (*) [16])(lVar13 + uVar43 * 4);
        auVar78 = vunpcklps_avx(auVar66,auVar65);
        auVar66 = vunpckhps_avx(auVar66,auVar65);
        auVar6 = vunpcklps_avx(auVar72,auVar66);
        auVar68 = vunpcklps_avx(auVar64,auVar78);
        auVar72 = vunpckhps_avx(auVar64,auVar78);
        auVar66 = *(undefined1 (*) [16])(lVar49 + local_1448 * 4);
        auVar65 = *(undefined1 (*) [16])(lVar12 + uVar52 * 4);
        auVar78 = vunpcklps_avx(auVar66,auVar65);
        auVar64 = vunpckhps_avx(auVar66,auVar65);
        auVar66 = *(undefined1 (*) [16])(lVar14 + local_1458 * 4);
        auVar65 = *(undefined1 (*) [16])(lVar13 + uVar50 * 4);
        auVar54 = vunpcklps_avx(auVar66,auVar65);
        auVar66 = vunpckhps_avx(auVar66,auVar65);
        auVar7 = vunpcklps_avx(auVar64,auVar66);
        auVar8 = vunpcklps_avx(auVar78,auVar54);
        auVar64 = vunpckhps_avx(auVar78,auVar54);
        auVar66 = *(undefined1 (*) [16])(lVar49 + uVar42 * 4);
        auVar65 = *(undefined1 (*) [16])(lVar12 + local_1470 * 4);
        auVar54 = vunpcklps_avx(auVar66,auVar65);
        auVar78 = vunpckhps_avx(auVar66,auVar65);
        auVar66 = *(undefined1 (*) [16])(lVar14 + local_1450 * 4);
        auVar65 = *(undefined1 (*) [16])(lVar13 + uVar37 * 4);
        auVar70 = vunpcklps_avx(auVar66,auVar65);
        auVar66 = vunpckhps_avx(auVar66,auVar65);
        auVar16 = vunpcklps_avx(auVar78,auVar66);
        auVar79 = vunpcklps_avx(auVar54,auVar70);
        auVar78 = vunpckhps_avx(auVar54,auVar70);
        auVar66 = *(undefined1 (*) [16])(lVar49 + uVar46 * 4);
        auVar65 = *(undefined1 (*) [16])(lVar12 + local_1460 * 4);
        auVar70 = vunpcklps_avx(auVar66,auVar65);
        auVar54 = vunpckhps_avx(auVar66,auVar65);
        auVar66 = *(undefined1 (*) [16])(lVar14 + local_1440 * 4);
        auVar65 = *(undefined1 (*) [16])(lVar13 + uVar45 * 4);
        auVar67 = vunpcklps_avx(auVar66,auVar65);
        auVar66 = vunpckhps_avx(auVar66,auVar65);
        auVar65 = vunpcklps_avx(auVar54,auVar66);
        auVar54 = vunpcklps_avx(auVar70,auVar67);
        auVar66 = vunpckhps_avx(auVar70,auVar67);
        fVar2 = 1.0 - fVar1;
        auVar67._4_4_ = fVar2;
        auVar67._0_4_ = fVar2;
        auVar67._8_4_ = fVar2;
        auVar67._12_4_ = fVar2;
        auVar73._0_4_ = fVar1 * auVar68._0_4_;
        auVar73._4_4_ = fVar1 * auVar68._4_4_;
        auVar73._8_4_ = fVar1 * auVar68._8_4_;
        auVar73._12_4_ = fVar1 * auVar68._12_4_;
        auVar68 = vfmadd231ps_fma(auVar73,auVar67,local_1300);
        auVar80._0_4_ = fVar1 * auVar72._0_4_;
        auVar80._4_4_ = fVar1 * auVar72._4_4_;
        auVar80._8_4_ = fVar1 * auVar72._8_4_;
        auVar80._12_4_ = fVar1 * auVar72._12_4_;
        auVar72 = vfmadd231ps_fma(auVar80,auVar67,local_12e0);
        auVar75._0_4_ = auVar6._0_4_ * fVar1;
        auVar75._4_4_ = auVar6._4_4_ * fVar1;
        auVar75._8_4_ = auVar6._8_4_ * fVar1;
        auVar75._12_4_ = auVar6._12_4_ * fVar1;
        auVar6 = vfmadd231ps_fma(auVar75,auVar67,local_12c0);
        auVar70._0_4_ = fVar1 * auVar8._0_4_;
        auVar70._4_4_ = fVar1 * auVar8._4_4_;
        auVar70._8_4_ = fVar1 * auVar8._8_4_;
        auVar70._12_4_ = fVar1 * auVar8._12_4_;
        auVar8 = vfmadd231ps_fma(auVar70,auVar67,local_12f0);
        auVar83._0_4_ = fVar1 * auVar64._0_4_;
        auVar83._4_4_ = fVar1 * auVar64._4_4_;
        auVar83._8_4_ = fVar1 * auVar64._8_4_;
        auVar83._12_4_ = fVar1 * auVar64._12_4_;
        auVar64 = vfmadd231ps_fma(auVar83,auVar67,local_12d0);
        auVar107._0_4_ = auVar7._0_4_ * fVar1;
        auVar107._4_4_ = auVar7._4_4_ * fVar1;
        auVar107._8_4_ = auVar7._8_4_ * fVar1;
        auVar107._12_4_ = auVar7._12_4_ * fVar1;
        auVar7 = vfmadd231ps_fma(auVar107,auVar67,local_12b0);
        auVar95._0_4_ = auVar79._0_4_ * fVar1;
        auVar95._4_4_ = auVar79._4_4_ * fVar1;
        auVar95._8_4_ = auVar79._8_4_ * fVar1;
        auVar95._12_4_ = auVar79._12_4_ * fVar1;
        auVar70 = vfmadd231ps_fma(auVar95,auVar67,local_1340);
        auVar102._0_4_ = auVar78._0_4_ * fVar1;
        auVar102._4_4_ = auVar78._4_4_ * fVar1;
        auVar102._8_4_ = auVar78._8_4_ * fVar1;
        auVar102._12_4_ = auVar78._12_4_ * fVar1;
        auVar78 = vfmadd231ps_fma(auVar102,auVar67,local_1330);
        auVar112._0_4_ = auVar16._0_4_ * fVar1;
        auVar112._4_4_ = auVar16._4_4_ * fVar1;
        auVar112._8_4_ = auVar16._8_4_ * fVar1;
        auVar112._12_4_ = auVar16._12_4_ * fVar1;
        auVar16 = vfmadd231ps_fma(auVar112,auVar67,local_1310);
        auVar79._0_4_ = fVar1 * auVar54._0_4_;
        auVar79._4_4_ = fVar1 * auVar54._4_4_;
        auVar79._8_4_ = fVar1 * auVar54._8_4_;
        auVar79._12_4_ = fVar1 * auVar54._12_4_;
        auVar89._0_4_ = auVar66._0_4_ * fVar1;
        auVar89._4_4_ = auVar66._4_4_ * fVar1;
        auVar89._8_4_ = auVar66._8_4_ * fVar1;
        auVar89._12_4_ = auVar66._12_4_ * fVar1;
        auVar54._0_4_ = auVar65._0_4_ * fVar1;
        auVar54._4_4_ = auVar65._4_4_ * fVar1;
        auVar54._8_4_ = auVar65._8_4_ * fVar1;
        auVar54._12_4_ = auVar65._12_4_ * fVar1;
        auVar66 = vfmadd231ps_fma(auVar79,auVar67,auVar5);
        auVar65 = vfmadd231ps_fma(auVar89,auVar67,local_1350);
        lVar12 = uVar53 + 0x40 + lVar38;
        local_fc0 = *(undefined8 *)(lVar12 + 0x10);
        uStack_fb8 = *(undefined8 *)(lVar12 + 0x18);
        uStack_fb0 = local_fc0;
        uStack_fa8 = uStack_fb8;
        lVar38 = uVar53 + 0x50 + lVar38;
        local_12a0 = *(undefined8 *)(lVar38 + 0x10);
        uStack_1298 = *(undefined8 *)(lVar38 + 0x18);
        auVar54 = vfmadd231ps_fma(auVar54,auVar67,local_1320);
        uStack_1290 = local_12a0;
        uStack_1288 = uStack_1298;
        auVar74._16_16_ = auVar70;
        auVar74._0_16_ = auVar68;
        auVar111._16_16_ = auVar78;
        auVar111._0_16_ = auVar72;
        auVar113._16_16_ = auVar16;
        auVar113._0_16_ = auVar6;
        auVar69._16_16_ = auVar8;
        auVar69._0_16_ = auVar8;
        auVar71._16_16_ = auVar64;
        auVar71._0_16_ = auVar64;
        auVar76._16_16_ = auVar7;
        auVar76._0_16_ = auVar7;
        auVar81._16_16_ = auVar66;
        auVar81._0_16_ = auVar66;
        auVar84._16_16_ = auVar65;
        auVar84._0_16_ = auVar65;
        auVar55._16_16_ = auVar54;
        auVar55._0_16_ = auVar54;
        auVar60 = vsubps_avx(auVar74,auVar69);
        auVar86 = vsubps_avx(auVar111,auVar71);
        auVar22 = vsubps_avx(auVar113,auVar76);
        auVar58 = vsubps_avx(auVar81,auVar74);
        auVar23 = vsubps_avx(auVar84,auVar111);
        auVar24 = vsubps_avx(auVar55,auVar113);
        auVar25._4_4_ = auVar86._4_4_ * auVar24._4_4_;
        auVar25._0_4_ = auVar86._0_4_ * auVar24._0_4_;
        auVar25._8_4_ = auVar86._8_4_ * auVar24._8_4_;
        auVar25._12_4_ = auVar86._12_4_ * auVar24._12_4_;
        auVar25._16_4_ = auVar86._16_4_ * auVar24._16_4_;
        auVar25._20_4_ = auVar86._20_4_ * auVar24._20_4_;
        auVar25._24_4_ = auVar86._24_4_ * auVar24._24_4_;
        auVar25._28_4_ = auVar8._12_4_;
        auVar64 = vfmsub231ps_fma(auVar25,auVar23,auVar22);
        auVar108._0_4_ = auVar22._0_4_ * auVar58._0_4_;
        auVar108._4_4_ = auVar22._4_4_ * auVar58._4_4_;
        auVar108._8_4_ = auVar22._8_4_ * auVar58._8_4_;
        auVar108._12_4_ = auVar22._12_4_ * auVar58._12_4_;
        auVar108._16_4_ = auVar22._16_4_ * auVar58._16_4_;
        auVar108._20_4_ = auVar22._20_4_ * auVar58._20_4_;
        auVar108._24_4_ = auVar22._24_4_ * auVar58._24_4_;
        auVar108._28_4_ = 0;
        auVar78 = vfmsub231ps_fma(auVar108,auVar24,auVar60);
        uVar3 = *(undefined4 *)(ray + k * 4);
        auVar77._4_4_ = uVar3;
        auVar77._0_4_ = uVar3;
        auVar77._8_4_ = uVar3;
        auVar77._12_4_ = uVar3;
        auVar77._16_4_ = uVar3;
        auVar77._20_4_ = uVar3;
        auVar77._24_4_ = uVar3;
        auVar77._28_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar85._4_4_ = uVar3;
        auVar85._0_4_ = uVar3;
        auVar85._8_4_ = uVar3;
        auVar85._12_4_ = uVar3;
        auVar85._16_4_ = uVar3;
        auVar85._20_4_ = uVar3;
        auVar85._24_4_ = uVar3;
        auVar85._28_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar56._4_4_ = uVar3;
        auVar56._0_4_ = uVar3;
        auVar56._8_4_ = uVar3;
        auVar56._12_4_ = uVar3;
        auVar56._16_4_ = uVar3;
        auVar56._20_4_ = uVar3;
        auVar56._24_4_ = uVar3;
        auVar56._28_4_ = uVar3;
        fVar1 = *(float *)(ray + k * 4 + 0x40);
        auVar100._4_4_ = fVar1;
        auVar100._0_4_ = fVar1;
        auVar100._8_4_ = fVar1;
        auVar100._12_4_ = fVar1;
        auVar100._16_4_ = fVar1;
        auVar100._20_4_ = fVar1;
        auVar100._24_4_ = fVar1;
        auVar100._28_4_ = fVar1;
        auVar25 = vsubps_avx(auVar74,auVar77);
        fVar2 = *(float *)(ray + k * 4 + 0x50);
        auVar105._4_4_ = fVar2;
        auVar105._0_4_ = fVar2;
        auVar105._8_4_ = fVar2;
        auVar105._12_4_ = fVar2;
        auVar105._16_4_ = fVar2;
        auVar105._20_4_ = fVar2;
        auVar105._24_4_ = fVar2;
        auVar105._28_4_ = fVar2;
        auVar55 = vsubps_avx(auVar111,auVar85);
        local_1140 = ZEXT1632(auVar78);
        fVar88 = *(float *)(ray + k * 4 + 0x60);
        auVar109._4_4_ = fVar88;
        auVar109._0_4_ = fVar88;
        auVar109._8_4_ = fVar88;
        auVar109._12_4_ = fVar88;
        auVar109._16_4_ = fVar88;
        auVar109._20_4_ = fVar88;
        auVar109._24_4_ = fVar88;
        auVar109._28_4_ = fVar88;
        auVar56 = vsubps_avx(auVar113,auVar56);
        auVar27._4_4_ = fVar1 * auVar55._4_4_;
        auVar27._0_4_ = fVar1 * auVar55._0_4_;
        auVar27._8_4_ = fVar1 * auVar55._8_4_;
        auVar27._12_4_ = fVar1 * auVar55._12_4_;
        auVar27._16_4_ = fVar1 * auVar55._16_4_;
        auVar27._20_4_ = fVar1 * auVar55._20_4_;
        auVar27._24_4_ = fVar1 * auVar55._24_4_;
        auVar27._28_4_ = uVar3;
        auVar66 = vfmsub231ps_fma(auVar27,auVar25,auVar105);
        auVar28._4_4_ = auVar24._4_4_ * auVar66._4_4_;
        auVar28._0_4_ = auVar24._0_4_ * auVar66._0_4_;
        auVar28._8_4_ = auVar24._8_4_ * auVar66._8_4_;
        auVar28._12_4_ = auVar24._12_4_ * auVar66._12_4_;
        auVar28._16_4_ = auVar24._16_4_ * 0.0;
        auVar28._20_4_ = auVar24._20_4_ * 0.0;
        auVar28._24_4_ = auVar24._24_4_ * 0.0;
        auVar28._28_4_ = auVar24._28_4_;
        auVar57._0_4_ = auVar22._0_4_ * auVar66._0_4_;
        auVar57._4_4_ = auVar22._4_4_ * auVar66._4_4_;
        auVar57._8_4_ = auVar22._8_4_ * auVar66._8_4_;
        auVar57._12_4_ = auVar22._12_4_ * auVar66._12_4_;
        auVar57._16_4_ = auVar22._16_4_ * 0.0;
        auVar57._20_4_ = auVar22._20_4_ * 0.0;
        auVar57._24_4_ = auVar22._24_4_ * 0.0;
        auVar57._28_4_ = 0;
        auVar24._4_4_ = fVar88 * auVar25._4_4_;
        auVar24._0_4_ = fVar88 * auVar25._0_4_;
        auVar24._8_4_ = fVar88 * auVar25._8_4_;
        auVar24._12_4_ = fVar88 * auVar25._12_4_;
        auVar24._16_4_ = fVar88 * auVar25._16_4_;
        auVar24._20_4_ = fVar88 * auVar25._20_4_;
        auVar24._24_4_ = fVar88 * auVar25._24_4_;
        auVar24._28_4_ = auVar22._28_4_;
        auVar65 = vfmsub231ps_fma(auVar24,auVar56,auVar100);
        auVar66 = vfmadd231ps_fma(auVar28,ZEXT1632(auVar65),auVar23);
        auVar65 = vfmadd231ps_fma(auVar57,auVar86,ZEXT1632(auVar65));
        auVar22._4_4_ = auVar60._4_4_ * auVar23._4_4_;
        auVar22._0_4_ = auVar60._0_4_ * auVar23._0_4_;
        auVar22._8_4_ = auVar60._8_4_ * auVar23._8_4_;
        auVar22._12_4_ = auVar60._12_4_ * auVar23._12_4_;
        auVar22._16_4_ = auVar60._16_4_ * auVar23._16_4_;
        auVar22._20_4_ = auVar60._20_4_ * auVar23._20_4_;
        auVar22._24_4_ = auVar60._24_4_ * auVar23._24_4_;
        auVar22._28_4_ = auVar23._28_4_;
        auVar54 = vfmsub231ps_fma(auVar22,auVar58,auVar86);
        auVar23._4_4_ = fVar2 * auVar56._4_4_;
        auVar23._0_4_ = fVar2 * auVar56._0_4_;
        auVar23._8_4_ = fVar2 * auVar56._8_4_;
        auVar23._12_4_ = fVar2 * auVar56._12_4_;
        auVar23._16_4_ = fVar2 * auVar56._16_4_;
        auVar23._20_4_ = fVar2 * auVar56._20_4_;
        auVar23._24_4_ = fVar2 * auVar56._24_4_;
        auVar23._28_4_ = auVar86._28_4_;
        auVar5 = vfmsub231ps_fma(auVar23,auVar55,auVar109);
        fVar1 = auVar54._0_4_;
        fVar2 = auVar54._4_4_;
        auVar29._4_4_ = fVar88 * fVar2;
        auVar29._0_4_ = fVar88 * fVar1;
        fVar17 = auVar54._8_4_;
        auVar29._8_4_ = fVar88 * fVar17;
        fVar18 = auVar54._12_4_;
        auVar29._12_4_ = fVar88 * fVar18;
        auVar29._16_4_ = fVar88 * 0.0;
        auVar29._20_4_ = fVar88 * 0.0;
        auVar29._24_4_ = fVar88 * 0.0;
        auVar29._28_4_ = fVar88;
        auVar72 = vfmadd231ps_fma(auVar29,local_1140,auVar105);
        auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),ZEXT1632(auVar64),auVar100);
        auVar96._8_4_ = 0x80000000;
        auVar96._0_8_ = 0x8000000080000000;
        auVar96._12_4_ = 0x80000000;
        auVar96._16_4_ = 0x80000000;
        auVar96._20_4_ = 0x80000000;
        auVar96._24_4_ = 0x80000000;
        auVar96._28_4_ = 0x80000000;
        auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),ZEXT1632(auVar5),auVar58);
        auVar86 = vandps_avx(ZEXT1632(auVar72),auVar96);
        uVar40 = auVar86._0_4_;
        auVar82._0_4_ = (float)(uVar40 ^ auVar66._0_4_);
        uVar36 = auVar86._4_4_;
        auVar82._4_4_ = (float)(uVar36 ^ auVar66._4_4_);
        uVar98 = auVar86._8_4_;
        auVar82._8_4_ = (float)(uVar98 ^ auVar66._8_4_);
        uVar99 = auVar86._12_4_;
        auVar82._12_4_ = (float)(uVar99 ^ auVar66._12_4_);
        local_11a0._16_4_ = auVar86._16_4_;
        auVar82._16_4_ = local_11a0._16_4_;
        local_11a0._20_4_ = auVar86._20_4_;
        auVar82._20_4_ = local_11a0._20_4_;
        local_11a0._24_4_ = auVar86._24_4_;
        auVar82._24_4_ = local_11a0._24_4_;
        local_11a0._28_4_ = auVar86._28_4_;
        auVar82._28_4_ = local_11a0._28_4_;
        auVar66 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar60,ZEXT1632(auVar5));
        local_11c0._0_4_ = (float)(uVar40 ^ auVar66._0_4_);
        local_11c0._4_4_ = (float)(uVar36 ^ auVar66._4_4_);
        local_11c0._8_4_ = (float)(uVar98 ^ auVar66._8_4_);
        local_11c0._12_4_ = (float)(uVar99 ^ auVar66._12_4_);
        local_11c0._16_4_ = local_11a0._16_4_;
        local_11c0._20_4_ = local_11a0._20_4_;
        local_11c0._24_4_ = local_11a0._24_4_;
        local_11c0._28_4_ = local_11a0._28_4_;
        auVar60 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar86 = vcmpps_avx(auVar82,auVar60,5);
        auVar60 = vcmpps_avx(local_11c0,auVar60,5);
        auVar86 = vandps_avx(auVar60,auVar86);
        auVar90._8_4_ = 0x7fffffff;
        auVar90._0_8_ = 0x7fffffff7fffffff;
        auVar90._12_4_ = 0x7fffffff;
        auVar90._16_4_ = 0x7fffffff;
        auVar90._20_4_ = 0x7fffffff;
        auVar90._24_4_ = 0x7fffffff;
        auVar90._28_4_ = 0x7fffffff;
        local_1180 = vandps_avx(ZEXT1632(auVar72),auVar90);
        auVar60 = vcmpps_avx(ZEXT1632(auVar72),ZEXT1232(ZEXT412(0)) << 0x20,4);
        auVar86 = vandps_avx(auVar60,auVar86);
        auVar58._0_4_ = auVar82._0_4_ + local_11c0._0_4_;
        auVar58._4_4_ = auVar82._4_4_ + local_11c0._4_4_;
        auVar58._8_4_ = auVar82._8_4_ + local_11c0._8_4_;
        auVar58._12_4_ = auVar82._12_4_ + local_11c0._12_4_;
        auVar58._16_4_ = local_11a0._16_4_ + local_11a0._16_4_;
        auVar58._20_4_ = local_11a0._20_4_ + local_11a0._20_4_;
        auVar58._24_4_ = local_11a0._24_4_ + local_11a0._24_4_;
        auVar58._28_4_ = local_11a0._28_4_ + local_11a0._28_4_;
        auVar60 = vcmpps_avx(auVar58,local_1180,2);
        auVar22 = auVar60 & auVar86;
        if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0x7f,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar22 >> 0xbf,0) != '\0') ||
            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar22[0x1f] < '\0') {
          auVar86 = vandps_avx(auVar86,auVar60);
          auVar66 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
          auVar30._4_4_ = fVar2 * auVar56._4_4_;
          auVar30._0_4_ = fVar1 * auVar56._0_4_;
          auVar30._8_4_ = fVar17 * auVar56._8_4_;
          auVar30._12_4_ = fVar18 * auVar56._12_4_;
          auVar30._16_4_ = auVar56._16_4_ * 0.0;
          auVar30._20_4_ = auVar56._20_4_ * 0.0;
          auVar30._24_4_ = auVar56._24_4_ * 0.0;
          auVar30._28_4_ = auVar56._28_4_;
          auVar65 = vfmadd213ps_fma(auVar55,local_1140,auVar30);
          auVar65 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar64),ZEXT1632(auVar65));
          local_11a0._0_4_ = (float)(uVar40 ^ auVar65._0_4_);
          local_11a0._4_4_ = (float)(uVar36 ^ auVar65._4_4_);
          local_11a0._8_4_ = (float)(uVar98 ^ auVar65._8_4_);
          local_11a0._12_4_ = (float)(uVar99 ^ auVar65._12_4_);
          fVar88 = *(float *)(ray + k * 4 + 0x30);
          auVar31._4_4_ = local_1180._4_4_ * fVar88;
          auVar31._0_4_ = local_1180._0_4_ * fVar88;
          auVar31._8_4_ = local_1180._8_4_ * fVar88;
          auVar31._12_4_ = local_1180._12_4_ * fVar88;
          auVar31._16_4_ = local_1180._16_4_ * fVar88;
          auVar31._20_4_ = local_1180._20_4_ * fVar88;
          auVar31._24_4_ = local_1180._24_4_ * fVar88;
          auVar31._28_4_ = fVar88;
          auVar86 = vcmpps_avx(auVar31,local_11a0,1);
          fVar88 = *(float *)(ray + k * 4 + 0x80);
          auVar32._4_4_ = local_1180._4_4_ * fVar88;
          auVar32._0_4_ = local_1180._0_4_ * fVar88;
          auVar32._8_4_ = local_1180._8_4_ * fVar88;
          auVar32._12_4_ = local_1180._12_4_ * fVar88;
          auVar32._16_4_ = local_1180._16_4_ * fVar88;
          auVar32._20_4_ = local_1180._20_4_ * fVar88;
          auVar32._24_4_ = local_1180._24_4_ * fVar88;
          auVar32._28_4_ = fVar88;
          auVar60 = vcmpps_avx(local_11a0,auVar32,2);
          auVar86 = vandps_avx(auVar86,auVar60);
          auVar65 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
          auVar66 = vpand_avx(auVar65,auVar66);
          auVar86 = vpmovzxwd_avx2(auVar66);
          auVar86 = vpslld_avx2(auVar86,0x1f);
          if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar86 >> 0x7f,0) != '\0') ||
                (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar86 >> 0xbf,0) != '\0') ||
              (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar86[0x1f] < '\0') {
            local_1400 = vpsrad_avx2(auVar86,0x1f);
            local_11e0 = auVar82;
            local_1160 = ZEXT1632(auVar64);
            local_1120 = ZEXT1632(auVar54);
            local_1100 = local_1400;
            local_1020 = local_fe0;
            auVar60 = vrcpps_avx(local_1180);
            auVar103._8_4_ = 0x3f800000;
            auVar103._0_8_ = &DAT_3f8000003f800000;
            auVar103._12_4_ = 0x3f800000;
            auVar103._16_4_ = 0x3f800000;
            auVar103._20_4_ = 0x3f800000;
            auVar103._24_4_ = 0x3f800000;
            auVar103._28_4_ = 0x3f800000;
            auVar65 = vfnmadd213ps_fma(local_1180,auVar60,auVar103);
            auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar60,auVar60);
            fVar88 = auVar65._0_4_;
            fVar92 = auVar65._4_4_;
            local_10a0._4_4_ = fVar92 * local_11a0._4_4_;
            local_10a0._0_4_ = fVar88 * local_11a0._0_4_;
            fVar93 = auVar65._8_4_;
            local_10a0._8_4_ = fVar93 * local_11a0._8_4_;
            fVar94 = auVar65._12_4_;
            local_10a0._12_4_ = fVar94 * local_11a0._12_4_;
            local_10a0._16_4_ = local_11a0._16_4_ * 0.0;
            local_10a0._20_4_ = local_11a0._20_4_ * 0.0;
            local_10a0._24_4_ = local_11a0._24_4_ * 0.0;
            local_10a0._28_4_ = local_11a0._28_4_;
            auVar63 = ZEXT3264(local_10a0);
            auVar33._4_4_ = fVar92 * auVar82._4_4_;
            auVar33._0_4_ = fVar88 * auVar82._0_4_;
            auVar33._8_4_ = fVar93 * auVar82._8_4_;
            auVar33._12_4_ = fVar94 * auVar82._12_4_;
            auVar33._16_4_ = local_11a0._16_4_ * 0.0;
            auVar33._20_4_ = local_11a0._20_4_ * 0.0;
            auVar33._24_4_ = local_11a0._24_4_ * 0.0;
            auVar33._28_4_ = auVar60._28_4_;
            auVar60 = vminps_avx(auVar33,auVar103);
            auVar34._4_4_ = fVar92 * local_11c0._4_4_;
            auVar34._0_4_ = fVar88 * local_11c0._0_4_;
            auVar34._8_4_ = fVar93 * local_11c0._8_4_;
            auVar34._12_4_ = fVar94 * local_11c0._12_4_;
            auVar34._16_4_ = local_11a0._16_4_ * 0.0;
            auVar34._20_4_ = local_11a0._20_4_ * 0.0;
            auVar34._24_4_ = local_11a0._24_4_ * 0.0;
            auVar34._28_4_ = local_11a0._28_4_;
            auVar22 = vminps_avx(auVar34,auVar103);
            auVar58 = vsubps_avx(auVar103,auVar60);
            auVar23 = vsubps_avx(auVar103,auVar22);
            local_10c0 = vblendvps_avx(auVar22,auVar58,local_fe0);
            local_10e0 = vblendvps_avx(auVar60,auVar23,local_fe0);
            fVar88 = local_1000._0_4_;
            fVar92 = local_1000._4_4_;
            fVar93 = local_1000._8_4_;
            fVar94 = local_1000._12_4_;
            fVar19 = local_1000._16_4_;
            fVar20 = local_1000._20_4_;
            fVar21 = local_1000._24_4_;
            local_1060._0_4_ = auVar78._0_4_ * fVar88;
            local_1060._4_4_ = auVar78._4_4_ * fVar92;
            local_1060._8_4_ = auVar78._8_4_ * fVar93;
            local_1060._12_4_ = auVar78._12_4_ * fVar94;
            local_1060._16_4_ = fVar19 * 0.0;
            local_1060._20_4_ = fVar20 * 0.0;
            local_1060._24_4_ = fVar21 * 0.0;
            local_1060._28_4_ = 0;
            local_1040._0_4_ = fVar88 * fVar1;
            local_1040._4_4_ = fVar92 * fVar2;
            local_1040._8_4_ = fVar93 * fVar17;
            local_1040._12_4_ = fVar94 * fVar18;
            local_1040._16_4_ = fVar19 * 0.0;
            local_1040._20_4_ = fVar20 * 0.0;
            local_1040._24_4_ = fVar21 * 0.0;
            local_1040._28_4_ = 0;
            local_1080[0] = auVar64._0_4_ * fVar88;
            local_1080[1] = auVar64._4_4_ * fVar92;
            local_1080[2] = auVar64._8_4_ * fVar93;
            local_1080[3] = auVar64._12_4_ * fVar94;
            fStack_1070 = fVar19 * 0.0;
            fStack_106c = fVar20 * 0.0;
            fStack_1068 = fVar21 * 0.0;
            uStack_1064 = local_10e0._28_4_;
            auVar59._8_4_ = 0x7f800000;
            auVar59._0_8_ = 0x7f8000007f800000;
            auVar59._12_4_ = 0x7f800000;
            auVar59._16_4_ = 0x7f800000;
            auVar59._20_4_ = 0x7f800000;
            auVar59._24_4_ = 0x7f800000;
            auVar59._28_4_ = 0x7f800000;
            auVar86 = vblendvps_avx(auVar59,local_10a0,auVar86);
            auVar60 = vshufps_avx(auVar86,auVar86,0xb1);
            auVar60 = vminps_avx(auVar86,auVar60);
            auVar22 = vshufpd_avx(auVar60,auVar60,5);
            auVar60 = vminps_avx(auVar60,auVar22);
            auVar22 = vpermpd_avx2(auVar60,0x4e);
            auVar60 = vminps_avx(auVar60,auVar22);
            auVar86 = vcmpps_avx(auVar86,auVar60,0);
            auVar65 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
            auVar66 = vpand_avx(auVar65,auVar66);
            auVar86 = vpmovzxwd_avx2(auVar66);
            auVar60 = vpslld_avx2(auVar86,0x1f);
            auVar86 = local_1400;
            if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar60 >> 0x7f,0) != '\0') ||
                  (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar60 >> 0xbf,0) != '\0') ||
                (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar60[0x1f] < '\0') {
              auVar86 = vpsrad_avx2(auVar60,0x1f);
            }
            auVar87 = ZEXT3264(auVar86);
            local_1488 = pSVar9;
            local_1438 = lVar39;
LAB_00587e7c:
            uVar36 = vmovmskps_avx(auVar87._0_32_);
            uVar40 = 0;
            for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
              uVar40 = uVar40 + 1;
            }
            uVar43 = (ulong)uVar40;
            uVar36 = *(uint *)((long)&local_fc0 + uVar43 * 4);
            pGVar11 = (pSVar9->geometries).items[uVar36].ptr;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_1400 + uVar43 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar43 = (ulong)(uVar40 << 2);
                uVar3 = *(undefined4 *)(local_10e0 + uVar43);
                uVar4 = *(undefined4 *)(local_10c0 + uVar43);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10a0 + uVar43);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_1080 + uVar43);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1060 + uVar43);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1040 + uVar43);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_12a0 + uVar43);
                *(uint *)(ray + k * 4 + 0x120) = uVar36;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_00587ca8;
              }
              local_13e0 = auVar63._0_32_;
              uVar42 = (ulong)(uVar40 * 4);
              uVar3 = *(undefined4 *)(local_10e0 + uVar42);
              local_1240._4_4_ = uVar3;
              local_1240._0_4_ = uVar3;
              local_1240._8_4_ = uVar3;
              local_1240._12_4_ = uVar3;
              local_1230 = *(undefined4 *)(local_10c0 + uVar42);
              local_1210._4_4_ = uVar36;
              local_1210._0_4_ = uVar36;
              local_1210._8_4_ = uVar36;
              local_1210._12_4_ = uVar36;
              local_1220 = *(undefined4 *)((long)&local_12a0 + uVar42);
              uVar3 = *(undefined4 *)((long)local_1080 + uVar42);
              uVar4 = *(undefined4 *)(local_1060 + uVar42);
              local_1260._4_4_ = uVar4;
              local_1260._0_4_ = uVar4;
              local_1260._8_4_ = uVar4;
              local_1260._12_4_ = uVar4;
              uVar4 = *(undefined4 *)(local_1040 + uVar42);
              local_1250._4_4_ = uVar4;
              local_1250._0_4_ = uVar4;
              local_1250._8_4_ = uVar4;
              local_1250._12_4_ = uVar4;
              local_1270[0] = (RTCHitN)(char)uVar3;
              local_1270[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
              local_1270[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
              local_1270[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
              local_1270[4] = (RTCHitN)(char)uVar3;
              local_1270[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
              local_1270[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
              local_1270[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
              local_1270[8] = (RTCHitN)(char)uVar3;
              local_1270[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
              local_1270[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
              local_1270[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
              local_1270[0xc] = (RTCHitN)(char)uVar3;
              local_1270[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
              local_1270[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
              local_1270[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
              uStack_122c = local_1230;
              uStack_1228 = local_1230;
              uStack_1224 = local_1230;
              uStack_121c = local_1220;
              uStack_1218 = local_1220;
              uStack_1214 = local_1220;
              vpcmpeqd_avx2(ZEXT1632(local_1240),ZEXT1632(local_1240));
              uStack_11fc = context->user->instID[0];
              local_1200 = uStack_11fc;
              uStack_11f8 = uStack_11fc;
              uStack_11f4 = uStack_11fc;
              uStack_11f0 = context->user->instPrimID[0];
              uStack_11ec = uStack_11f0;
              uStack_11e8 = uStack_11f0;
              uStack_11e4 = uStack_11f0;
              uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10a0 + uVar42);
              local_14d0 = *local_14b8;
              uStack_14c8 = local_14b8[1];
              local_1430.valid = (int *)&local_14d0;
              local_1430.geometryUserPtr = pGVar11->userPtr;
              local_1430.context = context->user;
              local_1430.hit = local_1270;
              local_1430.N = 4;
              local_1430.ray = (RTCRayN *)ray;
              if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar11->intersectionFilterN)(&local_1430);
              }
              auVar5._8_8_ = uStack_14c8;
              auVar5._0_8_ = local_14d0;
              if (auVar5 == (undefined1  [16])0x0) {
                auVar66 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                auVar66 = auVar66 ^ _DAT_01febe20;
              }
              else {
                p_Var15 = context->args->filter;
                if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var15)(&local_1430);
                }
                auVar6._8_8_ = uStack_14c8;
                auVar6._0_8_ = local_14d0;
                auVar65 = vpcmpeqd_avx(auVar6,_DAT_01feba10);
                auVar66 = auVar65 ^ _DAT_01febe20;
                if (auVar6 != (undefined1  [16])0x0) {
                  auVar65 = auVar65 ^ _DAT_01febe20;
                  auVar72 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])local_1430.hit);
                  *(undefined1 (*) [16])(local_1430.ray + 0xc0) = auVar72;
                  auVar72 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])(local_1430.hit + 0x10));
                  *(undefined1 (*) [16])(local_1430.ray + 0xd0) = auVar72;
                  auVar72 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])(local_1430.hit + 0x20));
                  *(undefined1 (*) [16])(local_1430.ray + 0xe0) = auVar72;
                  auVar72 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])(local_1430.hit + 0x30));
                  *(undefined1 (*) [16])(local_1430.ray + 0xf0) = auVar72;
                  auVar72 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])(local_1430.hit + 0x40));
                  *(undefined1 (*) [16])(local_1430.ray + 0x100) = auVar72;
                  auVar72 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])(local_1430.hit + 0x50));
                  *(undefined1 (*) [16])(local_1430.ray + 0x110) = auVar72;
                  auVar72 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])(local_1430.hit + 0x60));
                  *(undefined1 (*) [16])(local_1430.ray + 0x120) = auVar72;
                  auVar72 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])(local_1430.hit + 0x70));
                  *(undefined1 (*) [16])(local_1430.ray + 0x130) = auVar72;
                  auVar65 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])(local_1430.hit + 0x80));
                  *(undefined1 (*) [16])(local_1430.ray + 0x140) = auVar65;
                }
              }
              auVar68._8_8_ = 0x100000001;
              auVar68._0_8_ = 0x100000001;
              if ((auVar68 & auVar66) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar3;
              }
              *(undefined4 *)(local_1400 + uVar43 * 4) = 0;
              uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar62._4_4_ = uVar3;
              auVar62._0_4_ = uVar3;
              auVar62._8_4_ = uVar3;
              auVar62._12_4_ = uVar3;
              auVar62._16_4_ = uVar3;
              auVar62._20_4_ = uVar3;
              auVar62._24_4_ = uVar3;
              auVar62._28_4_ = uVar3;
              auVar63 = ZEXT3264(local_13e0);
              auVar86 = vcmpps_avx(local_13e0,auVar62,2);
              local_1400 = vandps_avx(auVar86,local_1400);
            }
            auVar87 = ZEXT3264(local_1400);
            if ((((((((local_1400 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1400 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1400 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1400 >> 0x7f,0) == '\0') &&
                  (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_1400 >> 0xbf,0) == '\0') &&
                (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_1400[0x1f]) goto LAB_00587ca8;
            auVar61._8_4_ = 0x7f800000;
            auVar61._0_8_ = 0x7f8000007f800000;
            auVar61._12_4_ = 0x7f800000;
            auVar61._16_4_ = 0x7f800000;
            auVar61._20_4_ = 0x7f800000;
            auVar61._24_4_ = 0x7f800000;
            auVar61._28_4_ = 0x7f800000;
            auVar86 = vblendvps_avx(auVar61,auVar63._0_32_,local_1400);
            auVar60 = vshufps_avx(auVar86,auVar86,0xb1);
            auVar60 = vminps_avx(auVar86,auVar60);
            auVar22 = vshufpd_avx(auVar60,auVar60,5);
            auVar60 = vminps_avx(auVar60,auVar22);
            auVar22 = vpermpd_avx2(auVar60,0x4e);
            auVar60 = vminps_avx(auVar60,auVar22);
            auVar86 = vcmpps_avx(auVar86,auVar60,0);
            auVar60 = local_1400 & auVar86;
            if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar60 >> 0x7f,0) != '\0') ||
                  (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar60 >> 0xbf,0) != '\0') ||
                (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar60[0x1f] < '\0') {
              auVar86 = vandps_avx(auVar86,local_1400);
              auVar87 = ZEXT3264(auVar86);
            }
            goto LAB_00587e7c;
          }
        }
LAB_00587ca8:
        lVar39 = lVar39 + 1;
      } while (lVar39 != local_1480);
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar63 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
    auVar87 = ZEXT1664(local_1360);
    auVar91 = ZEXT1664(local_1370);
    auVar97 = ZEXT1664(local_1380);
    auVar101 = ZEXT1664(local_1390);
    auVar104 = ZEXT1664(local_13a0);
    auVar106 = ZEXT1664(local_13b0);
    auVar110 = ZEXT1664(local_13c0);
    uVar43 = local_1498;
    uVar42 = local_14a8;
    uVar46 = local_14b0;
    uVar47 = local_14a0;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }